

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O1

TPZVec<float> * __thiscall
TPZVec<float>::operator=(TPZVec<float> *this,initializer_list<float> *list)

{
  size_type sVar1;
  iterator pfVar2;
  float *pfVar3;
  long lVar4;
  
  (*this->_vptr_TPZVec[3])();
  sVar1 = list->_M_len;
  if (sVar1 != 0) {
    pfVar2 = list->_M_array;
    pfVar3 = this->fStore;
    lVar4 = 0;
    do {
      *(undefined4 *)((long)pfVar3 + lVar4) = *(undefined4 *)((long)pfVar2 + lVar4);
      lVar4 = lVar4 + 4;
    } while (sVar1 << 2 != lVar4);
  }
  return this;
}

Assistant:

TPZVec<T> &TPZVec<T>::operator=(const std::initializer_list<T> &list) {
	Resize(list.size());

	auto it = list.begin();
	auto it_end = list.end();
	auto *aux = fStore;

	for (; it != it_end; it++, aux++)
		*aux = *it;
	return *this;
}